

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_mod.c
# Opt level: O0

CONF_MODULE * module_find(char *name)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  CONF_MODULE *pCVar5;
  char *in_RDI;
  char *p;
  int nchar;
  int i;
  CONF_MODULE *tmod;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  
  pcVar3 = strrchr(in_RDI,0x2e);
  if (pcVar3 == (char *)0x0) {
    sVar4 = strlen(in_RDI);
    local_20 = (int)sVar4;
  }
  else {
    local_20 = (int)pcVar3 - (int)in_RDI;
  }
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = sk_CONF_MODULE_num((stack_st_CONF_MODULE *)0x3aa782);
    if (iVar1 <= iVar2) {
      return (CONF_MODULE *)0x0;
    }
    pCVar5 = sk_CONF_MODULE_value
                       ((stack_st_CONF_MODULE *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    iVar2 = strncmp(pCVar5->name,in_RDI,(long)local_20);
    if (iVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  return pCVar5;
}

Assistant:

static CONF_MODULE *module_find(const char *name)
{
    CONF_MODULE *tmod;
    int i, nchar;
    char *p;
    p = strrchr(name, '.');

    if (p)
        nchar = p - name;
    else
        nchar = strlen(name);

    for (i = 0; i < sk_CONF_MODULE_num(supported_modules); i++) {
        tmod = sk_CONF_MODULE_value(supported_modules, i);
        if (strncmp(tmod->name, name, nchar) == 0)
            return tmod;
    }

    return NULL;

}